

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_FSA_dns.c
# Opt level: O0

void PrintIC(N_Vector y,N_Vector yp)

{
  undefined8 *puVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype *data;
  
  puVar1 = (undefined8 *)N_VGetArrayPointer(in_RDI);
  printf("\n\nConsistent IC:\n");
  printf("\ty = ");
  printf("%12.4e %12.4e %12.4e \n",*puVar1,puVar1[1],puVar1[2]);
  puVar1 = (undefined8 *)N_VGetArrayPointer(in_RSI);
  printf("\typ= ");
  printf("%12.4e %12.4e %12.4e \n",*puVar1,puVar1[1],puVar1[2]);
  return;
}

Assistant:

static void PrintIC(N_Vector y, N_Vector yp)
{
  sunrealtype* data;

  data = N_VGetArrayPointer(y);
  printf("\n\nConsistent IC:\n");
  printf("\ty = ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le %12.4Le \n", data[0], data[1], data[2]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e %12.4e \n", data[0], data[1], data[2]);
#else
  printf("%12.4e %12.4e %12.4e \n", data[0], data[1], data[2]);
#endif

  data = N_VGetArrayPointer(yp);
  printf("\typ= ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le %12.4Le \n", data[0], data[1], data[2]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e %12.4e \n", data[0], data[1], data[2]);
#else
  printf("%12.4e %12.4e %12.4e \n", data[0], data[1], data[2]);
#endif
}